

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O2

uint __thiscall pstore::database::get_current_revision(database *this)

{
  uint uVar1;
  _func_int **local_18;
  
  get_footer((database *)&stack0xffffffffffffffe8);
  uVar1 = *(uint *)(local_18 + 1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  return uVar1;
}

Assistant:

unsigned get_current_revision () const { return get_footer ()->a.generation.load (); }